

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field_00;
  JavaType JVar1;
  Descriptor *pDVar2;
  FieldGeneratorInfo *pFVar3;
  Descriptor *descriptor;
  AlphaNum *a;
  Descriptor *descriptor_00;
  int i_1;
  ulong uVar4;
  long lVar5;
  int i;
  long lVar6;
  string sStack_d8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  FieldDescriptor *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x49) == '\0') {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              ((string *)&field,this->name_resolver_,*(FileDescriptor **)(pDVar2 + 0x10));
    UniqueFileScopeIdentifier_abi_cxx11_
              (&sStack_d8,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
               ,(char (*) [10])"fileclass",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
               (char (*) [11])0x3ceb60,&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&field);
  }
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 0;
  for (lVar6 = 0; pDVar2 = (this->super_MessageGenerator).descriptor_, lVar6 < *(int *)(pDVar2 + 4);
      lVar6 = lVar6 + 1) {
    field = (FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar5);
    JVar1 = GetJavaType(field);
    if (JVar1 == JAVATYPE_MESSAGE) {
      pDVar2 = FieldDescriptor::message_type(field);
      if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x4b) == '\x01') {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back(&map_fields,&field);
      }
    }
    lVar5 = lVar5 + 0x48;
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Print<>
              (printer,
               "@SuppressWarnings({\"rawtypes\"})\n@java.lang.Override\nprotected com.google.protobuf.MapField internalGetMapField(\n    int number) {\n  switch (number) {\n"
              );
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)map_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)map_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      field_00 = map_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4];
      pFVar3 = Context::GetFieldGeneratorInfo(this->context_,field_00);
      strings::AlphaNum::AlphaNum((AlphaNum *)&field,*(int *)(field_00 + 4));
      StrCat_abi_cxx11_(&sStack_d8,(protobuf *)&field,a);
      io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                (printer,"case $number$:\n  return internalGet$capitalized_name$();\n",
                 (char (*) [7])0x3f3265,&sStack_d8,(char (*) [17])0x3f2d7b,&pFVar3->capitalized_name
                );
      std::__cxx11::string::~string((string *)&sStack_d8);
    }
    io::Printer::Print<>
              (printer,
               "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
              );
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"  }\n}\n");
    pDVar2 = (this->super_MessageGenerator).descriptor_;
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&field,this->name_resolver_,pDVar2);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&sStack_d8,this->name_resolver_,
             *(FileDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x10));
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_50,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::
  Print<char[10],std::__cxx11::string,char[10],std::__cxx11::string,char[11],std::__cxx11::string,char[4],std::__cxx11::string>
            (printer,
             "@java.lang.Override\nprotected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
             ,(char (*) [10])0x3dd2a7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
             (char (*) [10])"fileclass",&sStack_d8,(char (*) [11])0x3ceb60,&local_50,
             (char (*) [4])0x3cdf4b,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&field);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&map_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateDescriptorMethods(
    io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "public static final com.google.protobuf.Descriptors.Descriptor\n"
        "    getDescriptor() {\n"
        "  return $fileclass$.internal_$identifier$_descriptor;\n"
        "}\n"
        "\n",
        "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
        "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "@java.lang.Override\n"
        "protected com.google.protobuf.MapField internalGetMapField(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGet$capitalized_name$();\n",
          "number", StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
      "@java.lang.Override\n"
      "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n"
      "    internalGetFieldAccessorTable() {\n"
      "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
      "      .ensureFieldAccessorsInitialized(\n"
      "          $classname$.class, $classname$.Builder.class);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_), "ver",
      GeneratedCodeVersionSuffix());
}